

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_args.c
# Opt level: O2

REF_STATUS ref_args_find(REF_INT n,char **args,char *target,REF_INT *pos)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  *pos = -1;
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  while( true ) {
    if (uVar2 == uVar3) {
      return 5;
    }
    iVar1 = strcmp(target,args[uVar3]);
    if (iVar1 == 0) break;
    uVar3 = uVar3 + 1;
  }
  *pos = (REF_INT)uVar3;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_args_find(REF_INT n, char **args, const char *target,
                                 REF_INT *pos) {
  REF_INT i;

  *pos = REF_EMPTY;

  for (i = 0; i < n; i++) {
    if (0 == strcmp(target, args[i])) {
      *pos = i;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}